

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,TPZGeoLinear *geo,int matind,TPZGeoMesh *mesh
          )

{
  int64_t iVar1;
  long lVar2;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_01882f90;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_01882be8,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018828e8;
  (this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_0188d208;
  iVar1 = (geo->super_TPZNodeRep<2,_pztopology::TPZLine>).fNodeIndexes[1];
  (this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0] =
       (geo->super_TPZNodeRep<2,_pztopology::TPZLine>).fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1] = iVar1;
  (this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoLinear_0188d180;
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  this->fNeighbours[0].fGeoElIndex = -1;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[1].fGeoElIndex = -1;
  this->fNeighbours[1].fSide = -1;
  this->fNeighbours[2].fGeoElIndex = -1;
  this->fNeighbours[2].fSide = -1;
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TGeo &geo,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(geo) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}